

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::SummaryTest_construction_with_dynamic_quantile_vector_Test::TestBody
          (SummaryTest_construction_with_dynamic_quantile_vector_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  Quantiles quantiles;
  Summary summary;
  allocator_type local_a9;
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  local_a8;
  Summary local_90;
  
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&local_90,0.99,0.001);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_90;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&local_a8,__l,&local_a9);
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&local_90,0.5,0.05);
  if (local_a8.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_a8.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
    ::_M_realloc_insert<prometheus::detail::CKMSQuantiles::Quantile>
              (&local_a8,
               (iterator)
               local_a8.
               super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
               ._M_impl.super__Vector_impl_data._M_finish,(Quantile *)&local_90);
  }
  else {
    (local_a8.
     super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
     ._M_impl.super__Vector_impl_data._M_finish)->u =
         (double)local_90.quantiles_.
                 super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_a8.
     super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
     ._M_impl.super__Vector_impl_data._M_finish)->v =
         (double)local_90.mutex_.super___mutex_base._M_mutex.__align;
    (local_a8.
     super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
     ._M_impl.super__Vector_impl_data._M_finish)->quantile =
         (double)local_90.quantiles_.
                 super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    (local_a8.
     super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
     ._M_impl.super__Vector_impl_data._M_finish)->error =
         (double)local_90.quantiles_.
                 super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_a8.
    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  Summary::Summary(&local_90,&local_a8,(milliseconds)0x3e8,2);
  Summary::Observe(&local_90,8.0);
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::~vector(&local_90.quantile_values_.ckms_quantiles_);
  if (local_90.quantiles_.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.quantiles_.
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.
      super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SummaryTest, construction_with_dynamic_quantile_vector) {
  auto quantiles = Summary::Quantiles{{0.99, 0.001}};
  quantiles.push_back({0.5, 0.05});

  Summary summary{quantiles, std::chrono::seconds(1), 2};
  summary.Observe(8.0);
}